

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O0

int shared_attach(int idx)

{
  int iVar1;
  int local_1c;
  int local_14;
  int r2;
  int r;
  int idx_local;
  
  r = shared_mux(idx,1);
  if (r == 0) {
    local_14 = shared_map(idx);
    if (local_14 == 0) {
      iVar1 = shared_attach_process(shared_gt[idx].sem);
      if (iVar1 == 0) {
        shared_lt[idx].tcnt = shared_lt[idx].tcnt + 1;
        if ((shared_gt[idx].attr & 4U) != 0) {
          iVar1 = shmdt(shared_lt[idx].p);
          if (iVar1 != 0) {
            local_14 = 0x9b;
          }
          shared_lt[idx].p = (BLKHEAD *)0x0;
        }
        shared_lt[idx].seekpos = 0;
        local_1c = shared_demux(idx,1);
        if (local_14 != 0) {
          local_1c = local_14;
        }
        r = local_1c;
      }
      else {
        shmdt(shared_lt[idx].p);
        shared_lt[idx].p = (BLKHEAD *)0x0;
        shared_demux(idx,1);
        r = 0x97;
      }
    }
    else {
      shared_demux(idx,1);
      r = local_14;
    }
  }
  return r;
}

Assistant:

int     shared_attach(int idx)
 { int r, r2;

   if (SHARED_OK != (r = shared_mux(idx, SHARED_RDWRITE | SHARED_WAIT))) return(r);
   if (SHARED_OK != (r = shared_map(idx)))
     { shared_demux(idx, SHARED_RDWRITE);
       return(r);
     }
   if (shared_attach_process(shared_gt[idx].sem))       /* try attach process */
     { shmdt((char *)(shared_lt[idx].p));               /* cannot attach process, detach everything */
       shared_lt[idx].p = NULL;
       shared_demux(idx, SHARED_RDWRITE);
       return(SHARED_BADARG);
     }
   shared_lt[idx].tcnt++;                               /* one more thread is using segment */
   if (shared_gt[idx].attr & SHARED_RESIZE)             /* if resizeable, detach and return special pointer */
     { if (shmdt((char *)(shared_lt[idx].p))) r = SHARED_IPCERR;  /* if segment is resizable, then detach segment */
       shared_lt[idx].p = NULL;
     }
   shared_lt[idx].seekpos = 0L;                         /* r/w pointer positioned at beg of block */
   r2 = shared_demux(idx, SHARED_RDWRITE);
   return(r ? r : r2);
 }